

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.h
# Opt level: O0

void __thiscall Token::print(Token *this)

{
  ostream *poVar1;
  Token *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->syn);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::operator<<(poVar1,(string *)&this->token);
  poVar1 = std::operator<<(poVar1,") {");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->start_pos).row);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->start_pos).col);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->start_pos).index);
  poVar1 = std::operator<<(poVar1,"} - {");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->end_pos).row);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->end_pos).col);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->end_pos).index);
  std::operator<<(poVar1,"}");
  return;
}

Assistant:

void print() const {
        std::cout << "(" << syn << "," << token << ") {"
                  << start_pos.row << ", " << start_pos.col << ", " << start_pos.index << "} - {"
                  << end_pos.row << ", " << end_pos.col << ", " << end_pos.index << "}";
    }